

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UBool utext_moveIndex32_63(UText *ut,int32_t delta)

{
  UBool UVar1;
  UChar32 UVar2;
  int local_1c;
  UChar32 c;
  int32_t delta_local;
  UText *ut_local;
  
  local_1c = delta;
  if (delta < 1) {
    if (delta < 0) {
      do {
        if ((ut->chunkOffset < 1) &&
           (UVar1 = utext_access(ut,ut->chunkNativeStart,'\0'), UVar1 == '\0')) {
          return '\0';
        }
        if ((ut->chunkContents[ut->chunkOffset + -1] & 0xf800U) == 0xd800) {
          UVar2 = utext_previous32_63(ut);
          if (UVar2 == -1) {
            return '\0';
          }
        }
        else {
          ut->chunkOffset = ut->chunkOffset + -1;
        }
        local_1c = local_1c + 1;
      } while (local_1c < 0);
    }
  }
  else {
    do {
      if ((ut->chunkLength <= ut->chunkOffset) &&
         (UVar1 = utext_access(ut,ut->chunkNativeLimit,'\x01'), UVar1 == '\0')) {
        return '\0';
      }
      if ((ut->chunkContents[ut->chunkOffset] & 0xf800U) == 0xd800) {
        UVar2 = utext_next32_63(ut);
        if (UVar2 == -1) {
          return '\0';
        }
      }
      else {
        ut->chunkOffset = ut->chunkOffset + 1;
      }
      local_1c = local_1c + -1;
    } while (0 < local_1c);
  }
  return '\x01';
}

Assistant:

U_CAPI UBool U_EXPORT2
utext_moveIndex32(UText *ut, int32_t delta) {
    UChar32  c;
    if (delta > 0) {
        do {
            if(ut->chunkOffset>=ut->chunkLength && !utext_access(ut, ut->chunkNativeLimit, TRUE)) {
                return FALSE;
            }
            c = ut->chunkContents[ut->chunkOffset];
            if (U16_IS_SURROGATE(c)) {
                c = utext_next32(ut);
                if (c == U_SENTINEL) {
                    return FALSE;
                }
            } else {
                ut->chunkOffset++;
            }
        } while(--delta>0);

    } else if (delta<0) {
        do {
            if(ut->chunkOffset<=0 && !utext_access(ut, ut->chunkNativeStart, FALSE)) {
                return FALSE;
            }
            c = ut->chunkContents[ut->chunkOffset-1];
            if (U16_IS_SURROGATE(c)) {
                c = utext_previous32(ut);
                if (c == U_SENTINEL) {
                    return FALSE;
                }
            } else {
                ut->chunkOffset--;
            }
        } while(++delta<0);
    }

    return TRUE;
}